

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

ATNMachine<wchar_t> * __thiscall
Centaurus::Grammar<wchar_t>::operator[](Grammar<wchar_t> *this,Identifier *id)

{
  mapped_type *pmVar1;
  Identifier *id_local;
  Grammar<wchar_t> *this_local;
  
  pmVar1 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
           ::at(&this->m_networks,id);
  return pmVar1;
}

Assistant:

const ATNMachine<TCHAR>& operator[](const Identifier& id) const
    {
        return m_networks.at(id);
    }